

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isonumber.c
# Opt level: O3

char * isonumber_from_s64(isonumber_str *out,int64_t number,char *unit,uint64_t scaling,_Bool raw)

{
  isonumber_str *piVar1;
  size_t out_len;
  char *out_00;
  
  out_len = 0x30;
  out_00 = out->buf;
  if (number < 0) {
    out_00 = out->buf + 1;
    out->buf[0] = '-';
    out_len = 0x2f;
    number = -number;
  }
  piVar1 = (isonumber_str *)_isonumber_u64_to_string(out_00,out_len,number,unit,scaling,raw);
  if (piVar1 != (isonumber_str *)0x0) {
    piVar1 = out;
  }
  return piVar1->buf;
}

Assistant:

const char *
isonumber_from_s64(struct isonumber_str *out, int64_t number, const char *unit, uint64_t scaling, bool raw) {
  char *outbuf = out->buf;
  uint64_t num;
  size_t len;

  len = sizeof(*out);
  if (number == INT64_MIN) {
    *outbuf++ = '-';
    len--;
    num = 1ull << 63;
  }
  else if (number < 0) {
    *outbuf++ = '-';
    len--;
    num = (uint64_t)(-number);
  }
  else {
    num = (uint64_t)number;
  }

  if (_isonumber_u64_to_string(outbuf, len, num, unit, scaling, raw)) {
    return out->buf;
  }
  return NULL;
}